

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O3

bool __thiscall re2::Regexp::ParseState::ParsePerlFlags(ParseState *this,StringPiece *s)

{
  char *pcVar1;
  re2 *this_00;
  RegexpStatus *pRVar2;
  byte bVar3;
  bool bVar4;
  size_type sVar5;
  ParseFlags PVar6;
  uint uVar7;
  int iVar8;
  StringPiece t;
  Rune c;
  StringPiece local_1c8;
  LogMessage local_1b0;
  
  local_1c8.ptr_ = s->ptr_;
  local_1c8.length_ = s->length_;
  local_1c8._12_4_ = *(undefined4 *)&s->field_0xc;
  PVar6 = this->flags_;
  if (((((PVar6 >> 9 & 1) == 0) || (local_1c8.length_ < 2)) || (*local_1c8.ptr_ != '(')) ||
     (local_1c8.ptr_[1] != '?')) {
    LogMessage::LogMessage
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/parse.cc",0x776
               ,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_1b0 + 8),"Bad call to ParseState::ParsePerlFlags",0x26);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
    this->status_->code_ = kRegexpInternalError;
  }
  else {
    pcVar1 = local_1c8.ptr_ + 2;
    local_1c8.length_ = local_1c8.length_ - 2;
    if ((((uint)local_1c8.length_ < 3) || (*pcVar1 != 'P')) || (local_1c8.ptr_[3] != '<')) {
      local_1c8.ptr_ = pcVar1;
      if (local_1c8.length_ != 0) {
        bVar4 = false;
        bVar3 = 0;
        do {
          iVar8 = StringPieceToRune(&local_1b0.severity_,&local_1c8,this->status_);
          if (iVar8 < 0) {
            return false;
          }
          if (local_1b0.severity_ < 0x69) {
            if (0x39 < local_1b0.severity_) {
              if (local_1b0.severity_ == 0x55) {
                if (bVar4) {
                  PVar6 = PVar6 & ~NonGreedy;
                }
                else {
                  PVar6 = PVar6 | NonGreedy;
                }
                goto LAB_00120537;
              }
              if (local_1b0.severity_ == 0x3a) {
                DoLeftParenNoCapture(this);
                goto LAB_001205e5;
              }
              break;
            }
            if (local_1b0.severity_ != 0x2d) {
              if (local_1b0.severity_ == 0x29) {
LAB_001205e5:
                if ((bool)(bVar3 | ~bVar4)) {
                  this->flags_ = PVar6;
                  s->length_ = local_1c8.length_;
                  s->ptr_ = local_1c8.ptr_;
                  return true;
                }
              }
              break;
            }
            if (bVar4) break;
            bVar4 = true;
            bVar3 = 0;
          }
          else {
            if (local_1b0.severity_ == 0x73) {
              if (bVar4) {
                PVar6 = PVar6 & ~DotNL;
              }
              else {
                PVar6 = PVar6 | DotNL;
              }
            }
            else if (local_1b0.severity_ == 0x6d) {
              if (bVar4) {
                PVar6 = PVar6 | OneLine;
              }
              else {
                PVar6 = PVar6 & ~OneLine;
              }
            }
            else {
              if (local_1b0.severity_ != 0x69) break;
              if (bVar4) {
                PVar6 = PVar6 & ~FoldCase;
              }
              else {
                PVar6 = PVar6 | FoldCase;
              }
            }
LAB_00120537:
            bVar3 = 1;
          }
        } while (local_1c8.length_ != 0);
      }
      pRVar2 = this->status_;
      pRVar2->code_ = kRegexpBadPerlOp;
      pcVar1 = s->ptr_;
      (pRVar2->error_arg_).ptr_ = pcVar1;
      (pRVar2->error_arg_).length_ = (int)local_1c8.ptr_ - (int)pcVar1;
    }
    else {
      local_1c8.ptr_ = pcVar1;
      sVar5 = StringPiece::find(&local_1c8,'>',2);
      pcVar1 = local_1c8.ptr_;
      if (sVar5 == 0xffffffffffffffff) {
        bVar4 = IsValidUTF8(s,this->status_);
        if (bVar4) {
          pRVar2 = this->status_;
          pRVar2->code_ = kRegexpBadNamedCapture;
          (pRVar2->error_arg_).ptr_ = s->ptr_;
          (pRVar2->error_arg_).length_ = s->length_;
        }
      }
      else {
        this_00 = (re2 *)(local_1c8.ptr_ + 2);
        uVar7 = (int)sVar5 - 2;
        local_1b0._0_8_ = this_00;
        local_1b0._8_4_ = uVar7;
        bVar4 = IsValidUTF8((StringPiece *)&local_1b0,this->status_);
        if (bVar4) {
          iVar8 = (int)sVar5 + 3;
          bVar4 = IsValidCaptureName(this_00,(StringPiece *)(ulong)uVar7);
          if (bVar4) {
            DoLeftParen(this,(StringPiece *)&local_1b0);
            iVar8 = ((int)(pcVar1 + -2) + iVar8) - (int)s->ptr_;
            s->ptr_ = s->ptr_ + iVar8;
            s->length_ = s->length_ - iVar8;
            return true;
          }
          pRVar2 = this->status_;
          pRVar2->code_ = kRegexpBadNamedCapture;
          (pRVar2->error_arg_).ptr_ = pcVar1 + -2;
          (pRVar2->error_arg_).length_ = iVar8;
        }
      }
    }
  }
  return false;
}

Assistant:

bool Regexp::ParseState::ParsePerlFlags(StringPiece* s) {
  StringPiece t = *s;

  // Caller is supposed to check this.
  if (!(flags_ & PerlX) || t.size() < 2 || t[0] != '(' || t[1] != '?') {
    LOG(DFATAL) << "Bad call to ParseState::ParsePerlFlags";
    status_->set_code(kRegexpInternalError);
    return false;
  }

  t.remove_prefix(2);  // "(?"

  // Check for named captures, first introduced in Python's regexp library.
  // As usual, there are three slightly different syntaxes:
  //
  //   (?P<name>expr)   the original, introduced by Python
  //   (?<name>expr)    the .NET alteration, adopted by Perl 5.10
  //   (?'name'expr)    another .NET alteration, adopted by Perl 5.10
  //
  // Perl 5.10 gave in and implemented the Python version too,
  // but they claim that the last two are the preferred forms.
  // PCRE and languages based on it (specifically, PHP and Ruby)
  // support all three as well.  EcmaScript 4 uses only the Python form.
  //
  // In both the open source world (via Code Search) and the
  // Google source tree, (?P<expr>name) is the dominant form,
  // so that's the one we implement.  One is enough.
  if (t.size() > 2 && t[0] == 'P' && t[1] == '<') {
    // Pull out name.
    size_t end = t.find('>', 2);
    if (end == t.npos) {
      if (!IsValidUTF8(*s, status_))
        return false;
      status_->set_code(kRegexpBadNamedCapture);
      status_->set_error_arg(*s);
      return false;
    }

    // t is "P<name>...", t[end] == '>'
    StringPiece capture(t.begin()-2, static_cast<int>(end)+3);  // "(?P<name>"
    StringPiece name(t.begin()+2, static_cast<int>(end)-2);     // "name"
    if (!IsValidUTF8(name, status_))
      return false;
    if (!IsValidCaptureName(name)) {
      status_->set_code(kRegexpBadNamedCapture);
      status_->set_error_arg(capture);
      return false;
    }

    if (!DoLeftParen(name)) {
      // DoLeftParen's failure set status_.
      return false;
    }

    s->remove_prefix(static_cast<int>(capture.end() - s->begin()));
    return true;
  }

  bool negated = false;
  bool sawflags = false;
  int nflags = flags_;
  Rune c;
  for (bool done = false; !done; ) {
    if (t.size() == 0)
      goto BadPerlOp;
    if (StringPieceToRune(&c, &t, status_) < 0)
      return false;
    switch (c) {
      default:
        goto BadPerlOp;

      // Parse flags.
      case 'i':
        sawflags = true;
        if (negated)
          nflags &= ~FoldCase;
        else
          nflags |= FoldCase;
        break;

      case 'm':  // opposite of our OneLine
        sawflags = true;
        if (negated)
          nflags |= OneLine;
        else
          nflags &= ~OneLine;
        break;

      case 's':
        sawflags = true;
        if (negated)
          nflags &= ~DotNL;
        else
          nflags |= DotNL;
        break;

      case 'U':
        sawflags = true;
        if (negated)
          nflags &= ~NonGreedy;
        else
          nflags |= NonGreedy;
        break;

      // Negation
      case '-':
        if (negated)
          goto BadPerlOp;
        negated = true;
        sawflags = false;
        break;

      // Open new group.
      case ':':
        if (!DoLeftParenNoCapture()) {
          // DoLeftParenNoCapture's failure set status_.
          return false;
        }
        done = true;
        break;

      // Finish flags.
      case ')':
        done = true;
        break;
    }
  }

  if (negated && !sawflags)
    goto BadPerlOp;

  flags_ = static_cast<Regexp::ParseFlags>(nflags);
  *s = t;
  return true;

BadPerlOp:
  status_->set_code(kRegexpBadPerlOp);
  status_->set_error_arg(
      StringPiece(s->begin(), static_cast<int>(t.begin() - s->begin())));
  return false;
}